

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  undefined4 *puVar3;
  curl_slist *pcVar4;
  _Bool _Var5;
  CURLcode CVar6;
  char *pcVar7;
  curl_off_t cVar8;
  char *pcVar9;
  bool bVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  CURLcode unaff_R12D;
  undefined8 *puVar15;
  bool bVar16;
  char *local_70;
  char *local_68;
  char *address;
  hostname host;
  
  *done = false;
  pCVar2 = conn->data;
  pcVar7 = (pCVar2->set).str[6];
  if (pcVar7 == (char *)0x0) {
    CVar6 = CURLE_OK;
  }
  else {
    CVar6 = Curl_urldecode(pCVar2,pcVar7,0,(char **)((long)(pCVar2->req).protop + 8),(size_t *)0x0,
                           true);
  }
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  pCVar2 = conn->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn->data;
  puVar3 = (undefined4 *)(pCVar2->req).protop;
  if (((pCVar2->set).field_0x913 & 0x10) != 0) {
    *puVar3 = 1;
  }
  *done = false;
  pcVar4 = (pCVar2->set).mail_rcpt;
  *(curl_slist **)(puVar3 + 4) = pcVar4;
  *(undefined1 *)(puVar3 + 6) = 0;
  puVar3[7] = 0;
  *(undefined1 *)(puVar3 + 10) = 1;
  *(undefined8 *)(puVar3 + 8) = 2;
  if (((pCVar2->set).field_0x913 & 0x20) == 0) {
    if (pcVar4 == (curl_slist *)0x0 || (pCVar2->set).mimepost.kind == MIMEKIND_NONE) {
LAB_00135aad:
      CVar6 = smtp_perform_command(conn);
      goto LAB_00135f41;
    }
  }
  else if (pcVar4 == (curl_slist *)0x0) goto LAB_00135aad;
  pcVar7 = (pCVar2->set).str[0x3b];
  if (pcVar7 == (char *)0x0) {
    local_68 = (*Curl_cstrdup)("<>");
    bVar10 = false;
  }
  else {
    address = (char *)0x0;
    host.name = (char *)0x0;
    host.dispname = (char *)0x0;
    host.rawalloc = (char *)0x0;
    host.encalloc = (char *)0x0;
    CVar6 = smtp_parse_address(conn,pcVar7,&address,&host);
    if (CVar6 == CURLE_OK) {
      if ((conn->proto).imapc.resptag[2] == '\x01') {
        bVar10 = true;
        if ((host.encalloc == (char *)0x0) && (_Var5 = Curl_is_ASCII_name(address), _Var5)) {
          _Var5 = Curl_is_ASCII_name(host.name);
          bVar10 = !_Var5;
        }
      }
      else {
        bVar10 = false;
      }
      if (host.name == (char *)0x0) {
        local_68 = curl_maprintf("<%s>",address);
      }
      else {
        local_68 = curl_maprintf("<%s@%s>",address);
        Curl_free_idnconverted_hostname(&host);
      }
      (*Curl_cfree)(address);
    }
    else {
      local_68 = (char *)0x0;
      bVar10 = false;
    }
    unaff_R12D = CVar6;
    if (CVar6 != CURLE_OK) goto LAB_00135f41;
  }
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (local_68 == (char *)0x0) goto LAB_00135f41;
  pcVar7 = (pCVar2->set).str[0x3c];
  if ((pcVar7 == (char *)0x0) || ((conn->proto).ftpc.cwdcount == 0)) {
    local_70 = (char *)0x0;
LAB_00135d2f:
    if ((pCVar2->set).mimepost.kind != MIMEKIND_NONE) {
      part = &(pCVar2->set).mimepost;
      puVar1 = &(pCVar2->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(pCVar2->set).headers,0);
      CVar6 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar6 == CURLE_OK) {
        pcVar7 = Curl_checkheaders(conn,"Mime-Version");
        CVar6 = CURLE_OK;
        if (pcVar7 == (char *)0x0) {
          CVar6 = Curl_mime_add_header(&(pCVar2->set).mimepost.curlheaders,"Mime-Version: 1.0");
        }
      }
      if (CVar6 == CURLE_OK) {
        CVar6 = Curl_mime_rewind(part);
      }
      if (CVar6 != CURLE_OK) {
        (*Curl_cfree)(local_68);
        (*Curl_cfree)(local_70);
        goto LAB_00135f41;
      }
      cVar8 = Curl_mime_size(part);
      (pCVar2->state).infilesize = cVar8;
      (pCVar2->state).fread_func = Curl_mime_read;
      (pCVar2->state).in = part;
    }
    if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (pCVar2->state).infilesize)) {
      pcVar7 = curl_maprintf("%ld");
      if (pcVar7 == (char *)0x0) {
        (*Curl_cfree)(local_68);
        (*Curl_cfree)(local_70);
        goto LAB_00135f3b;
      }
    }
    else {
      pcVar7 = (char *)0x0;
    }
    if ((((conn->proto).imapc.resptag[2] == '\x01') && (!bVar10)) &&
       (puVar15 = *(undefined8 **)((long)(pCVar2->req).protop + 0x10), puVar15 != (undefined8 *)0x0)
       ) {
      do {
        _Var5 = Curl_is_ASCII_name((char *)*puVar15);
        if (!_Var5) {
          bVar10 = true;
        }
        puVar15 = (undefined8 *)puVar15[1];
      } while ((puVar15 != (undefined8 *)0x0) && (!bVar10));
    }
    pcVar9 = " AUTH=";
    pcVar11 = local_70;
    if (local_70 == (char *)0x0) {
      pcVar9 = "";
      pcVar11 = "";
    }
    pcVar12 = " SIZE=";
    pcVar13 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar12 = "";
      pcVar13 = "";
    }
    pcVar14 = " SMTPUTF8";
    if (!bVar10) {
      pcVar14 = "";
    }
    CVar6 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s%s%s%s%s%s",local_68,pcVar9,pcVar11,
                          pcVar12,pcVar13,pcVar14);
    (*Curl_cfree)(local_68);
    (*Curl_cfree)(local_70);
    (*Curl_cfree)(pcVar7);
    if (CVar6 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_SELECT;
    }
  }
  else {
    if (*pcVar7 == '\0') {
      local_70 = (*Curl_cstrdup)("<>");
    }
    else {
      address = (char *)0x0;
      host.name = (char *)0x0;
      host.dispname = (char *)0x0;
      host.rawalloc = (char *)0x0;
      host.encalloc = (char *)0x0;
      CVar6 = smtp_parse_address(conn,pcVar7,&address,&host);
      if (CVar6 == CURLE_OK) {
        if (((!bVar10) && ((conn->proto).imapc.resptag[2] == '\x01')) &&
           ((host.encalloc != (char *)0x0 ||
            ((_Var5 = Curl_is_ASCII_name(address), !_Var5 ||
             (_Var5 = Curl_is_ASCII_name(host.name), !_Var5)))))) {
          bVar10 = true;
        }
        if (host.name == (char *)0x0) {
          local_70 = curl_maprintf("<%s>",address);
        }
        else {
          (*Curl_cfree)(local_68);
          local_70 = (char *)0x0;
          local_68 = curl_maprintf("<%s@%s>",address,host.name);
          Curl_free_idnconverted_hostname(&host);
        }
        (*Curl_cfree)(address);
        bVar16 = local_68 != (char *)0x0;
        CVar6 = CURLE_OUT_OF_MEMORY;
        if (bVar16) {
          CVar6 = unaff_R12D;
        }
      }
      else {
        (*Curl_cfree)(local_68);
        local_70 = (char *)0x0;
        bVar16 = false;
      }
      if (!bVar16) goto LAB_00135f41;
    }
    if (local_70 != (char *)0x0) goto LAB_00135d2f;
    (*Curl_cfree)(local_68);
LAB_00135f3b:
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
LAB_00135f41:
  if (CVar6 == CURLE_OK) {
    CVar6 = smtp_multi_statemach(conn,done);
  }
  if (((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, *done == true)) && (*(conn->data->req).protop != 0)
     ) {
    CVar6 = CURLE_OK;
    Curl_setup_transfer(conn->data,-1,-1,false,-1);
  }
  return CVar6;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}